

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,SeqStatement *seq_statement)

{
  char cVar1;
  
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->stream_,"SeqStatement:",0xd);
  cVar1 = (char)&this->stream_;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->stream_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(seq_statement->first_statement_->super_BaseElement)._vptr_BaseElement[2])
            (seq_statement->first_statement_,this);
  (*(seq_statement->second_statement_->super_BaseElement)._vptr_BaseElement[2])
            (seq_statement->second_statement_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(SeqStatement* seq_statement) {
  PrintTabs();
  stream_ << "SeqStatement:" << std::endl;

  ++num_tabs_;
  seq_statement->first_statement_->Accept(this);
  seq_statement->second_statement_->Accept(this);
  --num_tabs_;
}